

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O0

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  undefined8 *in_RDI;
  int in_stack_0000080c;
  int in_stack_00000810;
  int in_stack_00000814;
  string *in_stack_00000818;
  TutorialApplication *in_stack_00000820;
  string *in_stack_fffffffffffffe38;
  string *description;
  anon_class_1_0_00000001_for_f *in_stack_fffffffffffffe40;
  allocator *f;
  string *name;
  Application *this_00;
  undefined1 local_171 [40];
  allocator local_149;
  string local_148 [39];
  undefined1 local_121 [40];
  undefined1 local_f9 [56];
  allocator local_c1;
  string local_c0 [192];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"collide",&local_c1);
  TutorialApplication::TutorialApplication
            (in_stack_00000820,in_stack_00000818,in_stack_00000814,in_stack_00000810,
             in_stack_0000080c);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  *in_RDI = &PTR__Tutorial_00620568;
  this_00 = (Application *)local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f9 + 1),"benchmark-collision",(allocator *)this_00);
  name = (string *)local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_121 + 1),"--benchmark-collision: benchmarks collision detection",
             (allocator *)name);
  Application::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_1_>
            (this_00,name,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string((string *)(local_121 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_121);
  std::__cxx11::string::~string((string *)(local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f9);
  f = &local_149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"complexity",f);
  description = (string *)local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_171 + 1),"--complexity: sets grid and sphere geometric complexity",
             (allocator *)description);
  Application::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_2_>
            (this_00,name,(anon_class_1_0_00000001_for_f *)f,description);
  std::__cxx11::string::~string((string *)(local_171 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_171);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  in_RDI[0x1c] = 0x40200000c0200000;
  in_RDI[0x1d] = 0xc0200000;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  return;
}

Assistant:

Tutorial()
      : TutorialApplication("collide",FEATURE_RTCORE)
    {
      registerOption("benchmark-collision", [] (Ref<ParseStream> cin, const FileName& path) {
          benchmark = true;
        }, "--benchmark-collision: benchmarks collision detection");

      registerOption("complexity", [] (Ref<ParseStream> cin, const FileName& path) {
          int N = cin->getInt();
          numPhi = N;
          numTheta = 2*numPhi;
          NX = N;
          NZ = N;
        }, "--complexity: sets grid and sphere geometric complexity");
                       
      camera.from = Vec3fa(-2.5f,2.5f,-2.5f);
      camera.to   = Vec3fa(0.0f,0.0f,0.0f);
    }